

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O3

MPP_RET mpp_h263_parser_setup_syntax(H263dParser ctx,MppSyntax *syntax)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  puVar2 = *(undefined1 **)((long)ctx + 0xa8);
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_setup_syntax");
  }
  *puVar2 = 1;
  puVar2[1] = *(undefined1 *)((long)ctx + 0x38);
  puVar2[2] = *(undefined1 *)((long)ctx + 0x48);
  *(undefined2 *)(puVar2 + 4) = *(undefined2 *)((long)ctx + 0x58);
  *(undefined2 *)(puVar2 + 8) = *(undefined2 *)((long)ctx + 0x88);
  *(undefined2 *)(puVar2 + 0xc) = 30000;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)((long)ctx + 0x3c);
  auVar5 = pshuflw(auVar5,auVar5,0xe8);
  *(int *)(puVar2 + 0x24) = auVar5._0_4_;
  *(undefined4 *)(puVar2 + 0x44) = *(undefined4 *)((long)ctx + 0x68);
  uVar1 = *(undefined4 *)((long)ctx + 0x60);
  *(undefined4 *)(puVar2 + 0x48) = uVar1;
  lVar3 = *(long *)((long)ctx + 0x30);
  lVar4 = *(long *)(puVar2 + 0x58);
  *(undefined4 *)(lVar4 + 0xc) = *(undefined4 *)(lVar3 + 0x40);
  *(undefined4 *)(lVar4 + 8) = uVar1;
  *(undefined8 *)(lVar4 + 0x28) = *(undefined8 *)(lVar3 + 0x38);
  syntax->number = 2;
  syntax->data = puVar2 + 0x50;
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_setup_syntax");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_h263_parser_setup_syntax(H263dParser ctx, MppSyntax *syntax)
{
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    h263d_dxva2_picture_context_t *syn = p->syntax;

    h263d_dbg_func("in\n");

    h263d_fill_picture_parameters(p, &syn->pp);

    // fill bit stream parameter
    syn->data[1]->DataSize   = p->bit_ctx->buf_len;
    syn->data[1]->DataOffset = p->hdr_curr.hdr_bits;
    syn->data[1]->pvPVPState = p->bit_ctx->buf;

    syntax->number = 2;
    syntax->data = syn->data;

    h263d_dbg_func("out\n");

    return MPP_OK;
}